

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLNode_move_child(XMLNode *node,int from,int to)

{
  _XMLNode *p_Var1;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  XMLNode *nfrom;
  int to_local;
  int from_local;
  XMLNode *node_local;
  
  if ((node == (XMLNode *)0x0) || (node->init_value != 0x19770522)) {
    node_local._4_4_ = 0;
  }
  else if ((from < 0) || (node->n_children <= from)) {
    node_local._4_4_ = 0;
  }
  else {
    nfrom._0_4_ = to;
    if (to < 0) {
      nfrom._0_4_ = 0;
    }
    if (node->n_children <= (int)nfrom) {
      nfrom._0_4_ = node->n_children + -1;
    }
    p_Var1 = node->children[from];
    local_2c = from;
    if (from < (int)nfrom) {
      for (; local_2c < (int)nfrom; local_2c = local_2c + 1) {
        node->children[local_2c] = node->children[local_2c + 1];
      }
    }
    else {
      for (local_30 = from + -1; (int)nfrom <= local_30; local_30 = local_30 + -1) {
        node->children[local_30 + 1] = node->children[local_30];
      }
    }
    node->children[(int)nfrom] = p_Var1;
    node_local._4_4_ = 1;
  }
  return node_local._4_4_;
}

Assistant:

int XMLNode_move_child(XMLNode* node, int from, int to)
{
	XMLNode* nfrom;

	CHECK_NODE(node, FALSE);
	if (from < 0 || from >= node->n_children)
		return FALSE;
	if (to < 0) /* Before first => first */
		to = 0;
	if (to >= node->n_children) /* After last => last */
		to = node->n_children - 1;

	nfrom = node->children[from];
	if (to > from) { /* Move forward: bring following nodes (up to 'to') backward one position */
		int i;
		for (i = from; i < to; i++)
			node->children[i] = node->children[i+1];
	} else { /* Move backward: bring previous nodes (up to 'from') forward one position */
		int i;
		for (i = from - 1; i >= to; i--)
			node->children[i+1] = node->children[i];
	}
	node->children[to] = nfrom;

	return TRUE;
}